

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

int __thiscall jrtplib::RTPUDPv6Transmitter::PollSocket(RTPUDPv6Transmitter *this,bool rtp)

{
  size_t *psVar1;
  RTPMemoryManager *pRVar2;
  in6_addr srcip;
  bool bVar3;
  int iVar4;
  ssize_t sVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _List_node_base *__dest;
  undefined4 extraout_var_01;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  _List_node_base *__n;
  int unaff_EBP;
  undefined7 in_register_00000031;
  bool bVar8;
  bool bVar9;
  int sock;
  timespec tpMono;
  size_t len;
  uint fromlen;
  sockaddr_in6 srcaddr;
  timespec tpMono_1;
  char packetbuffer [65535];
  int iStack_100b0;
  uint uStack_100ac;
  timespec tStack_100a8;
  long lStack_10098;
  uint uStack_1008c;
  int iStack_10088;
  socklen_t sStack_10084;
  _List_node_base *p_Stack_10080;
  list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_> *plStack_10078;
  _List_node_base *p_Stack_10070;
  sockaddr sStack_10064;
  undefined4 uStack_10054;
  undefined4 uStack_10050;
  timespec tStack_10048;
  int8_t aiStack_10038 [65544];
  
  uStack_100ac = (uint)CONCAT71(in_register_00000031,rtp);
  iStack_100b0 = *(int *)((long)(this->destinations).table + (ulong)!rtp * 4 + -0x5c);
  lStack_10098 = 0;
  ioctl(iStack_100b0,0x541b,&lStack_10098);
  if (lStack_10098 == 0) {
    unaff_EBP = RTPSelect(&iStack_100b0,aiStack_10038,1,(RTPTime)0x0);
    bVar8 = false;
    if (unaff_EBP < 0) {
      return unaff_EBP;
    }
  }
  else {
    bVar8 = true;
  }
  uStack_1008c = 2 - (uStack_100ac & 0xff);
  plStack_10078 = &this->rawpacketlist;
  p_Stack_10070 = (_List_node_base *)&PTR_CreateCopy_0013eb30;
  do {
    if (!bVar8) {
      return 0;
    }
    if (RTPTime::CurrentTime()::s_initialized == '\0') {
      RTPTime::CurrentTime()::s_initialized = '\x01';
      clock_gettime(0,&tStack_100a8);
      clock_gettime(1,&tStack_10048);
      p_Stack_10080 =
           (_List_node_base *)
           ((double)tStack_100a8.tv_nsec * 1e-09 +
           (double)CONCAT71(tStack_100a8.tv_sec._1_7_,(char)tStack_100a8.tv_sec));
      RTPTime::CurrentTime()::s_startOffet =
           (double)p_Stack_10080 -
           ((double)tStack_10048.tv_nsec * 1e-09 + (double)tStack_10048.tv_sec);
    }
    else {
      clock_gettime(1,&tStack_100a8);
      p_Stack_10080 =
           (_List_node_base *)
           ((double)tStack_100a8.tv_nsec * 1e-09 +
            (double)CONCAT71(tStack_100a8.tv_sec._1_7_,(char)tStack_100a8.tv_sec) +
           RTPTime::CurrentTime()::s_startOffet);
    }
    sStack_10084 = 0x1c;
    sVar5 = recvfrom(iStack_100b0,aiStack_10038,0xffff,0,&sStack_10064,&sStack_10084);
    if ((int)(uint)sVar5 < 1) {
LAB_00125c3f:
      lStack_10098 = 0;
      ioctl(iStack_100b0,0x541b,&lStack_10098);
      bVar9 = true;
      if (lStack_10098 == 0) {
        tStack_100a8.tv_sec._0_1_ = '\0';
        iVar4 = RTPSelect(&iStack_100b0,(int8_t *)&tStack_100a8,1,(RTPTime)0x0);
        bVar9 = -1 < iVar4;
        bVar3 = (char)tStack_100a8.tv_sec != '\0';
        if (!bVar9) {
          unaff_EBP = iVar4;
          bVar3 = bVar8;
        }
      }
      else {
        bVar3 = true;
      }
    }
    else {
      if (this->receivemode == AcceptAll) {
LAB_00125ad9:
        pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
        iStack_10088 = unaff_EBP;
        if (pRVar2 == (RTPMemoryManager *)0x0) {
          p_Var7 = (_List_node_base *)operator_new(0x20);
        }
        else {
          iVar4 = (*pRVar2->_vptr_RTPMemoryManager[2])(pRVar2,0x20,0x17);
          p_Var7 = (_List_node_base *)CONCAT44(extraout_var,iVar4);
        }
        *(undefined4 *)&p_Var7->_M_prev = 1;
        p_Var7->_M_next = p_Stack_10070;
        *(undefined4 *)((long)&p_Var7->_M_prev + 4) = sStack_10064.sa_data._6_4_;
        *(undefined4 *)&p_Var7[1]._M_next = sStack_10064.sa_data._10_4_;
        *(undefined4 *)((long)&p_Var7[1]._M_next + 4) = uStack_10054;
        *(undefined4 *)&p_Var7[1]._M_prev = uStack_10050;
        *(ushort *)((long)&p_Var7[1]._M_prev + 4) =
             sStack_10064.sa_data._0_2_ << 8 | (ushort)sStack_10064.sa_data._0_2_ >> 8;
        __n = (_List_node_base *)(ulong)((uint)sVar5 & 0x7fffffff);
        pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
        if (pRVar2 == (RTPMemoryManager *)0x0) {
          __dest = (_List_node_base *)operator_new__((ulong)__n);
        }
        else {
          iVar4 = (*pRVar2->_vptr_RTPMemoryManager[2])(pRVar2,__n,(ulong)uStack_1008c);
          __dest = (_List_node_base *)CONCAT44(extraout_var_00,iVar4);
        }
        bVar9 = __dest != (_List_node_base *)0x0;
        if (__dest == (_List_node_base *)0x0) {
          pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
          if (pRVar2 == (RTPMemoryManager *)0x0) {
            (*(code *)p_Var7->_M_next[2]._M_next)();
          }
          else {
            (*(code *)p_Var7->_M_next[1]._M_prev)(p_Var7);
            (*pRVar2->_vptr_RTPMemoryManager[3])(pRVar2,p_Var7);
          }
          unaff_EBP = -1;
        }
        else {
          memcpy(__dest,aiStack_10038,(size_t)__n);
          pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
          if (pRVar2 == (RTPMemoryManager *)0x0) {
            p_Var6 = (_List_node_base *)operator_new(0x38);
          }
          else {
            iVar4 = (*pRVar2->_vptr_RTPMemoryManager[2])(pRVar2,0x38,0x1b);
            p_Var6 = (_List_node_base *)CONCAT44(extraout_var_01,iVar4);
          }
          p_Var6->_M_prev =
               (_List_node_base *)(this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
          p_Var6->_M_next = (_List_node_base *)&PTR__RTPRawPacket_0013df10;
          p_Var6[2]._M_next = p_Stack_10080;
          p_Var6[1]._M_next = __dest;
          p_Var6[1]._M_prev = __n;
          p_Var6[2]._M_prev = p_Var7;
          *(char *)&p_Var6[3]._M_next = (char)uStack_100ac;
          p_Var7 = (_List_node_base *)operator_new(0x18);
          p_Var7[1]._M_next = p_Var6;
          std::__detail::_List_node_base::_M_hook(p_Var7);
          psVar1 = &(this->rawpacketlist).
                    super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          unaff_EBP = iStack_10088;
        }
      }
      else {
        srcip.__in6_u._4_1_ = sStack_10064.sa_data[10];
        srcip.__in6_u._5_1_ = sStack_10064.sa_data[0xb];
        srcip.__in6_u._6_1_ = sStack_10064.sa_data[0xc];
        srcip.__in6_u._7_1_ = sStack_10064.sa_data[0xd];
        srcip.__in6_u._0_1_ = sStack_10064.sa_data[6];
        srcip.__in6_u._1_1_ = sStack_10064.sa_data[7];
        srcip.__in6_u._2_1_ = sStack_10064.sa_data[8];
        srcip.__in6_u._3_1_ = sStack_10064.sa_data[9];
        srcip.__in6_u.__u6_addr32[2] = uStack_10054;
        srcip.__in6_u.__u6_addr32[3] = uStack_10050;
        bVar3 = ShouldAcceptData(this,srcip,
                                 sStack_10064.sa_data._0_2_ << 8 |
                                 (ushort)sStack_10064.sa_data._0_2_ >> 8);
        bVar9 = true;
        if (bVar3) goto LAB_00125ad9;
      }
      if (bVar9) goto LAB_00125c3f;
      bVar9 = false;
      bVar3 = bVar8;
    }
    bVar8 = bVar3;
    if (!bVar9) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

int RTPUDPv6Transmitter::PollSocket(bool rtp)
{
	RTPSOCKLENTYPE fromlen;
	int recvlen;
	char packetbuffer[RTPUDPV6TRANS_MAXPACKSIZE];
#ifdef RTP_SOCKETTYPE_WINSOCK
	SOCKET sock;
	unsigned long len;
#else 
	size_t len;
	int sock;
#endif // RTP_SOCKETTYPE_WINSOCK
	struct sockaddr_in6 srcaddr;
	bool dataavailable;
	
	if (rtp)
		sock = rtpsock;
	else
		sock = rtcpsock;
	
	len = 0;
	RTPIOCTL(sock,FIONREAD,&len);

	if (len <= 0) // make sure a packet of length zero is not queued
	{
		int8_t isset = 0;
		int status = RTPSelect(&sock, &isset, 1, RTPTime(0));
		if (status < 0)
			return status;

		if (isset)
			dataavailable = true;
		else
			dataavailable = false;
	}
	else
		dataavailable = true;

	while (dataavailable)
	{
		RTPTime curtime = RTPTime::CurrentTime();
		fromlen = sizeof(struct sockaddr_in6);
		recvlen = recvfrom(sock,packetbuffer,RTPUDPV6TRANS_MAXPACKSIZE,0,(struct sockaddr *)&srcaddr,&fromlen);
		if (recvlen > 0)
		{
			bool acceptdata;

			// got data, process it
			if (receivemode == RTPTransmitter::AcceptAll)
				acceptdata = true;
			else
				acceptdata = ShouldAcceptData(srcaddr.sin6_addr,ntohs(srcaddr.sin6_port));
			
			if (acceptdata)
			{
				RTPRawPacket *pack;
				RTPIPv6Address *addr;
				uint8_t *datacopy;

				addr = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPADDRESS) RTPIPv6Address(srcaddr.sin6_addr,ntohs(srcaddr.sin6_port));
				if (addr == 0)
					return ERR_RTP_OUTOFMEM;
				datacopy = RTPNew(GetMemoryManager(),(rtp)?RTPMEM_TYPE_BUFFER_RECEIVEDRTPPACKET:RTPMEM_TYPE_BUFFER_RECEIVEDRTCPPACKET) uint8_t[recvlen];
				if (datacopy == 0)
				{
					RTPDelete(addr,GetMemoryManager());
					return ERR_RTP_OUTOFMEM;
				}
				memcpy(datacopy,packetbuffer,recvlen);
				
				pack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPRAWPACKET) RTPRawPacket(datacopy,recvlen,addr,curtime,rtp,GetMemoryManager());
				if (pack == 0)
				{
					RTPDelete(addr,GetMemoryManager());
					RTPDeleteByteArray(datacopy,GetMemoryManager());
					return ERR_RTP_OUTOFMEM;
				}
				rawpacketlist.push_back(pack);	
			}
		}
		len = 0;
		RTPIOCTL(sock,FIONREAD,&len);

		if (len <= 0) // make sure a packet of length zero is not queued
		{
			int8_t isset = 0;
			int status = RTPSelect(&sock, &isset, 1, RTPTime(0));
			if (status < 0)
				return status;

			if (isset)
				dataavailable = true;
			else
				dataavailable = false;
		}
		else
			dataavailable = true;
	}
	return 0;
}